

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_cipher_do_ofb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  uint uVar1;
  gost_grasshopper_cipher_ctx *ctx_00;
  grasshopper_w128_t *buf;
  grasshopper_w128_t *iv;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  ctx_00 = (gost_grasshopper_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data();
  buf = (grasshopper_w128_t *)EVP_CIPHER_CTX_buf_noconst(ctx);
  iv = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  uVar1 = EVP_CIPHER_CTX_get_num(ctx);
  if ((int)uVar1 < 1) {
    uVar3 = 0;
  }
  else {
    for (uVar3 = 0; (uVar4 = uVar1 + uVar3, uVar4 < 0x10 && (uVar3 < inl)); uVar3 = uVar3 + 1) {
      out[uVar3] = in[uVar3] ^ buf->b[uVar3 + uVar1];
    }
    if (uVar4 != 0x10) {
      uVar4 = (ulong)(uVar1 + (int)uVar3);
      goto LAB_0011a33c;
    }
    out = out + uVar3;
    in = in + uVar3;
    EVP_CIPHER_CTX_set_num(ctx,0);
  }
  while (uVar3 + 0x10 < inl) {
    gost_grasshopper_cnt_next(ctx_00,iv,buf);
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      out[lVar2] = in[lVar2] ^ buf->b[lVar2];
    }
    in = in + 0x10;
    out = out + 0x10;
    uVar3 = uVar3 + 0x10;
  }
  uVar4 = 0;
  if (uVar3 < inl) {
    gost_grasshopper_cnt_next(ctx_00,iv,buf);
    for (uVar4 = 0; uVar3 + uVar4 < inl; uVar4 = uVar4 + 1) {
      out[uVar4] = in[uVar4] ^ buf->b[uVar4];
    }
  }
LAB_0011a33c:
  EVP_CIPHER_CTX_set_num(ctx,uVar4);
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_ofb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c = (gost_grasshopper_cipher_ctx *)
        EVP_CIPHER_CTX_get_cipher_data(ctx);
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    int num = EVP_CIPHER_CTX_num(ctx);
    size_t i = 0;
    size_t j;

    /* process partial block if any */
    if (num > 0) {
        for (j = (size_t)num, i = 0; j < GRASSHOPPER_BLOCK_SIZE && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            *out_ptr = buf[j] ^ (*in_ptr);
        }
        if (j == GRASSHOPPER_BLOCK_SIZE) {
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, (int)j);
            return 1;
        }
    }

    for (; i + GRASSHOPPER_BLOCK_SIZE <
         inl;
         i += GRASSHOPPER_BLOCK_SIZE, in_ptr +=
         GRASSHOPPER_BLOCK_SIZE, out_ptr += GRASSHOPPER_BLOCK_SIZE) {
        /*
         * block cipher current iv
         */
        /* Encrypt */
        gost_grasshopper_cnt_next(c, (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf);

        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        for (j = 0; j < GRASSHOPPER_BLOCK_SIZE; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
    }

    /* Process rest of buffer */
    if (i < inl) {
        gost_grasshopper_cnt_next(c, (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf);
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, (int)j);
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }

    return 1;
}